

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Cpu.cpp
# Opt level: O0

void __thiscall Kss_Cpu::Kss_Cpu(Kss_Cpu *this)

{
  int iVar1;
  byte bVar2;
  int n;
  int p;
  int even;
  int i;
  Kss_Cpu *this_local;
  
  this->state = &this->state_;
  i = 0x100;
  while (iVar1 = i + -1, -1 < iVar1) {
    even = 1;
    for (p = iVar1; p != 0; p = p >> 1) {
      even = p ^ even;
    }
    bVar2 = (byte)iVar1 & 0xa8 | (byte)((even & 1U) << 2);
    this->szpc[iVar1] = bVar2;
    this->szpc[i + 0xff] = bVar2 | 1;
    i = iVar1;
  }
  this->szpc[0] = this->szpc[0] | 0x40;
  this->szpc[0x100] = this->szpc[0x100] | 0x40;
  return;
}

Assistant:

Kss_Cpu::Kss_Cpu()
{
	state = &state_;
	
	for ( int i = 0x100; --i >= 0; )
	{
		int even = 1;
		for ( int p = i; p; p >>= 1 )
			even ^= p;
		int n = (i & (S80 | F20 | F08)) | ((even & 1) * P04);
		szpc [i] = n;
		szpc [i + 0x100] = n | C01;
	}
	szpc [0x000] |= Z40;
	szpc [0x100] |= Z40;
}